

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_noxious_ward(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  undefined2 uVar2;
  CHAR_DATA *in_RDX;
  undefined2 in_SI;
  int in_EDI;
  AFFECT_DATA af;
  AFFECT_DATA *in_stack_ffffffffffffff78;
  CHAR_DATA *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 uVar3;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  
  bVar1 = is_affected(in_RDX,in_EDI);
  if (bVar1) {
    send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                  CONCAT24(in_stack_ffffffffffffff94,
                                           CONCAT22(in_stack_ffffffffffffff92,
                                                    in_stack_ffffffffffffff90))),
                 in_stack_ffffffffffffff88);
  }
  else {
    init_affect((AFFECT_DATA *)0x6e3016);
    uVar3 = 0;
    uVar2 = (undefined2)in_EDI;
    affect_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    act((char *)CONCAT26(in_SI,CONCAT24(uVar2,CONCAT22(uVar3,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  }
  return;
}

Assistant:

void spell_noxious_ward(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, sn))
	{
		send_to_char("You are already protected by a noxious ward.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = sn;
	af.location = 0;
	af.duration = 12;
	af.level = level;
	af.modifier = 0;
	af.mod_name = MOD_PROTECTION;
	affect_to_char(ch, &af);

	act("You feel protected by a noxious ward.", ch, 0, 0, TO_CHAR);
}